

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O3

int bandit::run(int argc,char **argv,bool allow_further)

{
  int iVar1;
  choice_options choices;
  choice_options local_c0;
  
  local_c0.colorizers.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0.colorizers.map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c0.colorizers.map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0.colorizers.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0.colorizers.map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0.colorizers.default_it._M_node = (_Base_ptr)0x0;
  local_c0.formatters.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0.formatters.map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c0.formatters.map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0.formatters.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0.formatters.map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0.formatters.default_it._M_node = (_Base_ptr)0x0;
  local_c0.reporters.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0.reporters.map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c0.reporters.map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0.reporters.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0.reporters.map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0.reporters.default_it._M_node = (_Base_ptr)0x0;
  local_c0.colorizers.map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0.colorizers.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0.formatters.map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0.formatters.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0.reporters.map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0.reporters.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  use_default_colorizers(&local_c0);
  use_default_formatters(&local_c0);
  use_default_reporters(&local_c0);
  iVar1 = run(argc,argv,&local_c0,allow_further);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>_>
               *)&local_c0.reporters);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>_>
               *)&local_c0.formatters);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>_>
               *)&local_c0);
  return iVar1;
}

Assistant:

inline int run(int argc, char* argv[], bool allow_further = true) {
    detail::choice_options choices;

    use_defaults(choices);

    return run(argc, argv, choices, allow_further);
  }